

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_tree_init_stdfile
               (mpack_tree_t *tree,FILE *stdfile,size_t max_bytes,_Bool close_when_done)

{
  int iVar1;
  int iVar2;
  undefined8 *__ptr;
  int *piVar3;
  size_t __size;
  char *__ptr_00;
  size_t sVar4;
  long lVar5;
  
  if ((long)max_bytes < 0) {
    memset(tree,0,0xa0);
    (tree->nil_node).type = mpack_type_nil;
    *(undefined4 *)&tree->max_size = 0xffffffff;
    *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
    *(undefined4 *)&tree->max_nodes = 0xffffffff;
    *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
    tree->error = mpack_error_bug;
    return;
  }
  __ptr = (undefined8 *)malloc(0x1010);
  if (__ptr == (undefined8 *)0x0) {
    memset(tree,0,0xa0);
    (tree->nil_node).type = mpack_type_nil;
    *(undefined4 *)&tree->max_size = 0xffffffff;
    *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
    *(undefined4 *)&tree->max_nodes = 0xffffffff;
    *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
    tree->error = mpack_error_memory;
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0;
    fseek((FILE *)stdfile,0,2);
    iVar1 = *piVar3;
    __size = ftell((FILE *)stdfile);
    iVar2 = *piVar3;
    fseek((FILE *)stdfile,0,0);
    if (((long)__size < 0) || ((iVar1 != 0 || iVar2 != 0) || *piVar3 != 0)) {
      memset(tree,0,0xa0);
      (tree->nil_node).type = mpack_type_nil;
      *(undefined4 *)&tree->max_size = 0xffffffff;
      *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
      *(undefined4 *)&tree->max_nodes = 0xffffffff;
      *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
      tree->error = mpack_error_io;
    }
    else if (__size == 0) {
      memset(tree,0,0xa0);
      (tree->nil_node).type = mpack_type_nil;
      *(undefined4 *)&tree->max_size = 0xffffffff;
      *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
      *(undefined4 *)&tree->max_nodes = 0xffffffff;
      *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
      tree->error = mpack_error_invalid;
    }
    else if (max_bytes < __size && max_bytes != 0) {
      memset(tree,0,0xa0);
      (tree->nil_node).type = mpack_type_nil;
      *(undefined4 *)&tree->max_size = 0xffffffff;
      *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
      *(undefined4 *)&tree->max_nodes = 0xffffffff;
      *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
      tree->error = mpack_error_too_big;
    }
    else {
      __ptr_00 = (char *)malloc(__size);
      *__ptr = __ptr_00;
      if (__ptr_00 != (char *)0x0) {
        lVar5 = 0;
        do {
          sVar4 = fread(__ptr_00 + lVar5,1,__size - lVar5,(FILE *)stdfile);
          if (sVar4 == 0) {
            memset(tree,0,0xa0);
            (tree->nil_node).type = mpack_type_nil;
            *(undefined4 *)&tree->max_size = 0xffffffff;
            *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
            *(undefined4 *)&tree->max_nodes = 0xffffffff;
            *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
            tree->error = mpack_error_io;
            free(__ptr_00);
            goto LAB_00109883;
          }
          lVar5 = lVar5 + sVar4;
        } while (lVar5 < (long)__size);
        __ptr[1] = __size;
        memset(tree,0,0x88);
        (tree->nil_node).type = mpack_type_nil;
        *(undefined4 *)&tree->max_size = 0xffffffff;
        *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
        *(undefined4 *)&tree->max_nodes = 0xffffffff;
        *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
        tree->data = __ptr_00;
        tree->data_length = __size;
        tree->pool = (mpack_node_data_t *)0x0;
        tree->pool_count = 0;
        tree->next = (mpack_tree_page_t *)0x0;
        tree->context = __ptr;
        tree->teardown = mpack_file_tree_teardown;
        goto LAB_0010988f;
      }
      memset(tree,0,0xa0);
      (tree->nil_node).type = mpack_type_nil;
      *(undefined4 *)&tree->max_size = 0xffffffff;
      *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
      *(undefined4 *)&tree->max_nodes = 0xffffffff;
      *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
      tree->error = mpack_error_memory;
    }
LAB_00109883:
    free(__ptr);
  }
LAB_0010988f:
  if (!close_when_done) {
    return;
  }
  fclose((FILE *)stdfile);
  return;
}

Assistant:

void mpack_tree_init_stdfile(mpack_tree_t* tree, FILE* stdfile, size_t max_bytes, bool close_when_done) {
    if (!mpack_tree_file_check_max_bytes(tree, max_bytes))
        return;

    mpack_tree_init_stdfile_noclose(tree, stdfile, max_bytes);

    if (close_when_done)
        fclose(stdfile);
}